

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O2

void __thiscall SocketPP::TCPServer::onReceive(TCPServer *this,int fd,byte *buf,size_t len)

{
  Message MStack_28;
  
  Message::create(&MStack_28,(TCPStream)fd,buf,len);
  onReceive(this,&MStack_28);
  RawMsg::~RawMsg(&MStack_28.rawMsg);
  return;
}

Assistant:

void TCPServer::onReceive(int fd, const byte* buf, size_t len) {
    TCPServer::onReceive(Message::create(fd, buf, len));
}